

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmerge.c
# Opt level: O2

void h2v2_merged_upsample_565
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION in_row_group_ctr,
               JSAMPARRAY output_buf)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  jpeg_upsampler *pjVar5;
  JSAMPLE *pJVar6;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var7;
  _func_void_j_decompress_ptr *p_Var8;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var9;
  JSAMPROW pJVar10;
  JSAMPROW pJVar11;
  JSAMPROW pJVar12;
  JSAMPROW pJVar13;
  JSAMPROW pJVar14;
  JSAMPROW pJVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  
  pjVar5 = cinfo->upsample;
  pJVar6 = cinfo->sample_range_limit;
  p_Var7 = pjVar5[1].upsample;
  lVar19 = *(long *)&pjVar5[1].need_context_rows;
  p_Var8 = pjVar5[2].start_pass;
  p_Var9 = pjVar5[2].upsample;
  pJVar10 = (*input_buf)[in_row_group_ctr * 2];
  pJVar11 = (*input_buf)[(ulong)(in_row_group_ctr * 2) + 1];
  pJVar12 = input_buf[1][in_row_group_ctr];
  pJVar13 = input_buf[2][in_row_group_ctr];
  pJVar14 = *output_buf;
  pJVar15 = output_buf[1];
  uVar4 = cinfo->output_width;
  for (lVar16 = 0; uVar4 >> 1 != (uint)lVar16; lVar16 = lVar16 + 1) {
    uVar17 = (ulong)pJVar12[lVar16];
    uVar21 = (ulong)pJVar13[lVar16];
    lVar20 = (long)*(int *)(p_Var7 + uVar21 * 4);
    lVar18 = (long)*(int *)(lVar19 + uVar17 * 4);
    uVar23 = (ulong)pJVar10[lVar16 * 2];
    lVar22 = (long)(int)((ulong)(*(long *)(p_Var8 + uVar21 * 8) + *(long *)(p_Var9 + uVar17 * 8)) >>
                        0x10);
    uVar17 = (ulong)pJVar10[lVar16 * 2 + 1];
    bVar1 = pJVar6[lVar20 + uVar17];
    bVar2 = pJVar6[uVar17 + lVar22];
    bVar3 = pJVar6[uVar17 + lVar18];
    *(ushort *)(pJVar14 + lVar16 * 4) =
         (ushort)(pJVar6[uVar23 + lVar18] >> 3) |
         (pJVar6[lVar20 + uVar23] & 0xfff8) * 0x100 + (pJVar6[uVar23 + lVar22] & 0xfc) * 8;
    *(ushort *)(pJVar14 + lVar16 * 4 + 2) =
         (ushort)(bVar3 >> 3) | (bVar1 & 0xfff8) * 0x100 + (bVar2 & 0xfc) * 8;
    uVar21 = (ulong)pJVar11[lVar16 * 2];
    uVar17 = (ulong)pJVar11[lVar16 * 2 + 1];
    bVar1 = pJVar6[lVar20 + uVar17];
    bVar2 = pJVar6[lVar22 + uVar17];
    bVar3 = pJVar6[lVar18 + uVar17];
    *(ushort *)(pJVar15 + lVar16 * 4) =
         (ushort)(pJVar6[uVar21 + lVar18] >> 3) |
         (pJVar6[lVar20 + uVar21] & 0xfff8) * 0x100 + (pJVar6[uVar21 + lVar22] & 0xfc) * 8;
    *(ushort *)(pJVar15 + lVar16 * 4 + 2) =
         (ushort)(bVar3 >> 3) | (bVar1 & 0xfff8) * 0x100 + (bVar2 & 0xfc) * 8;
  }
  if ((uVar4 & 1) != 0) {
    uVar17 = (ulong)pJVar12[lVar16];
    uVar21 = (ulong)pJVar13[lVar16];
    lVar18 = (long)*(int *)(p_Var7 + uVar21 * 4);
    lVar19 = (long)*(int *)(lVar19 + uVar17 * 4);
    uVar23 = (ulong)pJVar10[lVar16 * 2];
    lVar20 = (long)(int)((ulong)(*(long *)(p_Var8 + uVar21 * 8) + *(long *)(p_Var9 + uVar17 * 8)) >>
                        0x10);
    *(ushort *)(pJVar14 + lVar16 * 4) =
         (ushort)(pJVar6[uVar23 + lVar19] >> 3) |
         (pJVar6[lVar18 + uVar23] & 0xfff8) * 0x100 + (pJVar6[uVar23 + lVar20] & 0xfc) * 8;
    uVar17 = (ulong)pJVar11[lVar16 * 2];
    *(ushort *)(pJVar15 + lVar16 * 4) =
         (ushort)(pJVar6[lVar19 + uVar17] >> 3) |
         (pJVar6[lVar18 + uVar17] & 0xfff8) * 0x100 + (pJVar6[lVar20 + uVar17] & 0xfc) * 8;
  }
  return;
}

Assistant:

METHODDEF(void)
h2v2_merged_upsample_565(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                         JDIMENSION in_row_group_ctr, JSAMPARRAY output_buf)
{
  if (is_big_endian())
    h2v2_merged_upsample_565_be(cinfo, input_buf, in_row_group_ctr,
                                output_buf);
  else
    h2v2_merged_upsample_565_le(cinfo, input_buf, in_row_group_ctr,
                                output_buf);
}